

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O3

void __thiscall
CoreML::Specification::SimpleRecurrentLayerParams::MergeFrom
          (SimpleRecurrentLayerParams *this,SimpleRecurrentLayerParams *from)

{
  void *pvVar1;
  LogMessage *other;
  ActivationParams *this_00;
  WeightParams *pWVar2;
  ActivationParams *from_00;
  WeightParams *pWVar3;
  LogFinisher local_51;
  LogMessage local_50;
  
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/build_O3/mlmodel/format/NeuralNetwork.pb.cc"
               ,0xa629);
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_50,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_51,other);
    google::protobuf::internal::LogMessage::~LogMessage(&local_50);
  }
  pvVar1 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
           .ptr_;
  if (((ulong)pvVar1 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (&this->_internal_metadata_,(string *)((ulong)pvVar1 & 0xfffffffffffffffe));
  }
  from_00 = from->activation_;
  if (from_00 != (ActivationParams *)0x0 &&
      from != (SimpleRecurrentLayerParams *)&_SimpleRecurrentLayerParams_default_instance_) {
    this_00 = this->activation_;
    if (this_00 == (ActivationParams *)0x0) {
      this_00 = (ActivationParams *)operator_new(0x20);
      ActivationParams::ActivationParams(this_00);
      this->activation_ = this_00;
      from_00 = from->activation_;
    }
    if (from_00 == (ActivationParams *)0x0) {
      from_00 = (ActivationParams *)&_ActivationParams_default_instance_;
    }
    ActivationParams::MergeFrom(this_00,from_00);
  }
  pWVar3 = from->weightmatrix_;
  if (pWVar3 != (WeightParams *)0x0 &&
      from != (SimpleRecurrentLayerParams *)&_SimpleRecurrentLayerParams_default_instance_) {
    pWVar2 = this->weightmatrix_;
    if (pWVar2 == (WeightParams *)0x0) {
      pWVar2 = (WeightParams *)operator_new(0x50);
      WeightParams::WeightParams(pWVar2);
      this->weightmatrix_ = pWVar2;
      pWVar3 = from->weightmatrix_;
    }
    if (pWVar3 == (WeightParams *)0x0) {
      pWVar3 = (WeightParams *)&_WeightParams_default_instance_;
    }
    WeightParams::MergeFrom(pWVar2,pWVar3);
  }
  pWVar3 = from->recursionmatrix_;
  if (pWVar3 != (WeightParams *)0x0 &&
      from != (SimpleRecurrentLayerParams *)&_SimpleRecurrentLayerParams_default_instance_) {
    pWVar2 = this->recursionmatrix_;
    if (pWVar2 == (WeightParams *)0x0) {
      pWVar2 = (WeightParams *)operator_new(0x50);
      WeightParams::WeightParams(pWVar2);
      this->recursionmatrix_ = pWVar2;
      pWVar3 = from->recursionmatrix_;
    }
    if (pWVar3 == (WeightParams *)0x0) {
      pWVar3 = (WeightParams *)&_WeightParams_default_instance_;
    }
    WeightParams::MergeFrom(pWVar2,pWVar3);
  }
  pWVar3 = from->biasvector_;
  if (pWVar3 != (WeightParams *)0x0 &&
      from != (SimpleRecurrentLayerParams *)&_SimpleRecurrentLayerParams_default_instance_) {
    pWVar2 = this->biasvector_;
    if (pWVar2 == (WeightParams *)0x0) {
      pWVar2 = (WeightParams *)operator_new(0x50);
      WeightParams::WeightParams(pWVar2);
      this->biasvector_ = pWVar2;
      pWVar3 = from->biasvector_;
    }
    if (pWVar3 == (WeightParams *)0x0) {
      pWVar3 = (WeightParams *)&_WeightParams_default_instance_;
    }
    WeightParams::MergeFrom(pWVar2,pWVar3);
  }
  if (from->inputvectorsize_ != 0) {
    this->inputvectorsize_ = from->inputvectorsize_;
  }
  if (from->outputvectorsize_ != 0) {
    this->outputvectorsize_ = from->outputvectorsize_;
  }
  if (from->sequenceoutput_ == true) {
    this->sequenceoutput_ = true;
  }
  if (from->hasbiasvector_ == true) {
    this->hasbiasvector_ = true;
  }
  if (from->reverseinput_ == true) {
    this->reverseinput_ = true;
  }
  return;
}

Assistant:

void SimpleRecurrentLayerParams::MergeFrom(const SimpleRecurrentLayerParams& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:CoreML.Specification.SimpleRecurrentLayerParams)
  GOOGLE_DCHECK_NE(&from, this);
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  if (from.has_activation()) {
    mutable_activation()->::CoreML::Specification::ActivationParams::MergeFrom(from.activation());
  }
  if (from.has_weightmatrix()) {
    mutable_weightmatrix()->::CoreML::Specification::WeightParams::MergeFrom(from.weightmatrix());
  }
  if (from.has_recursionmatrix()) {
    mutable_recursionmatrix()->::CoreML::Specification::WeightParams::MergeFrom(from.recursionmatrix());
  }
  if (from.has_biasvector()) {
    mutable_biasvector()->::CoreML::Specification::WeightParams::MergeFrom(from.biasvector());
  }
  if (from.inputvectorsize() != 0) {
    set_inputvectorsize(from.inputvectorsize());
  }
  if (from.outputvectorsize() != 0) {
    set_outputvectorsize(from.outputvectorsize());
  }
  if (from.sequenceoutput() != 0) {
    set_sequenceoutput(from.sequenceoutput());
  }
  if (from.hasbiasvector() != 0) {
    set_hasbiasvector(from.hasbiasvector());
  }
  if (from.reverseinput() != 0) {
    set_reverseinput(from.reverseinput());
  }
}